

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O3

void alloc_compressor_data(AV1_COMP *cpi)

{
  PC_TREE_SHARED_BUFFERS *shared_bufs;
  int iVar1;
  MvCosts *pMVar2;
  PICK_MODE_CONTEXT *pPVar3;
  
  (*(cpi->common).mi_params.set_mb_mi)
            (&(cpi->common).mi_params,(cpi->common).width,(cpi->common).height,
             (cpi->sf).part_sf.default_min_partition_size);
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    av1_alloc_txb_buf(cpi);
  }
  aom_free((cpi->td).mv_costs_alloc);
  (cpi->td).mv_costs_alloc = (MvCosts *)0x0;
  if ((cpi->oxcf).kf_cfg.key_freq_max != 0) {
    pMVar2 = (MvCosts *)aom_calloc(1,0x80028);
    (cpi->td).mv_costs_alloc = pMVar2;
    if (pMVar2 == (MvCosts *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->td.mv_costs_alloc");
      pMVar2 = (cpi->td).mv_costs_alloc;
    }
    (cpi->td).mb.mv_costs = pMVar2;
  }
  shared_bufs = &(cpi->td).shared_coeff_buf;
  av1_setup_shared_coeff_buffer((cpi->common).seq_params,shared_bufs,(cpi->common).error);
  iVar1 = av1_setup_sms_tree(cpi,&cpi->td);
  if (iVar1 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate SMS tree");
  }
  pPVar3 = av1_alloc_pmc(cpi,BLOCK_16X16,shared_bufs);
  (cpi->td).firstpass_ctx = pPVar3;
  if (pPVar3 != (PICK_MODE_CONTEXT *)0x0) {
    return;
  }
  aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT")
  ;
  return;
}

Assistant:

static inline void alloc_compressor_data(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CommonModeInfoParams *const mi_params = &cm->mi_params;

  // Setup mi_params
  mi_params->set_mb_mi(mi_params, cm->width, cm->height,
                       cpi->sf.part_sf.default_min_partition_size);

  if (!is_stat_generation_stage(cpi)) av1_alloc_txb_buf(cpi);

  aom_free(cpi->td.mv_costs_alloc);
  cpi->td.mv_costs_alloc = NULL;
  // Avoid the memory allocation of 'mv_costs_alloc' for allintra encoding
  // mode.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0) {
    CHECK_MEM_ERROR(cm, cpi->td.mv_costs_alloc,
                    (MvCosts *)aom_calloc(1, sizeof(*cpi->td.mv_costs_alloc)));
    cpi->td.mb.mv_costs = cpi->td.mv_costs_alloc;
  }

  av1_setup_shared_coeff_buffer(cm->seq_params, &cpi->td.shared_coeff_buf,
                                cm->error);
  if (av1_setup_sms_tree(cpi, &cpi->td)) {
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate SMS tree");
  }
  cpi->td.firstpass_ctx =
      av1_alloc_pmc(cpi, BLOCK_16X16, &cpi->td.shared_coeff_buf);
  if (!cpi->td.firstpass_ctx)
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate PICK_MODE_CONTEXT");
}